

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

Script * cfd::core::ScriptUtil::CreateP2pkhLockingScript
                   (Script *__return_storage_ptr__,ByteData160 *pubkey_hash)

{
  ScriptBuilder builder;
  ScriptBuilder local_38;
  
  local_38._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007daaa0;
  local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendOperator(&local_38,(ScriptOperator *)ScriptOperator::OP_DUP);
  ScriptBuilder::AppendOperator(&local_38,(ScriptOperator *)ScriptOperator::OP_HASH160);
  ScriptBuilder::AppendData(&local_38,pubkey_hash);
  ScriptBuilder::AppendOperator(&local_38,(ScriptOperator *)ScriptOperator::OP_EQUALVERIFY);
  ScriptBuilder::AppendOperator(&local_38,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
  ScriptBuilder::Build(__return_storage_ptr__,&local_38);
  local_38._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007daaa0;
  if (local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.script_byte_array_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.script_byte_array_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2pkhLockingScript(const ByteData160& pubkey_hash) {
  // script作成
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(pubkey_hash);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);

  return builder.Build();
}